

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gwham.hpp
# Opt level: O0

valtype __thiscall
WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
::whamvsrawi(WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
             *this,uint *i,
            gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double> *rho)

{
  double dVar1;
  unsigned_long uVar2;
  bool bVar3;
  const_reference _gnarr;
  unsigned_long uVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  pointer ppVar7;
  element_type *peVar8;
  double dVar9;
  double extraout_XMM0_Qa;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  valtype pwham;
  vector<double,_std::allocator<double>_> vals;
  coordtype coord;
  valtype praw;
  _Base_ptr local_120;
  double local_118;
  valtype eta;
  const_iterator it;
  pEnsemble Vi;
  valtype Qinv;
  valtype sum;
  gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double> hist;
  gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double> *rho_local;
  uint *i_local;
  WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
  *this_local;
  
  hist.nelms_tot = (ulong)rho;
  _gnarr = std::
           vector<gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_std::allocator<gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>_>_>
           ::operator[](this->hists,(ulong)*i);
  gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>::gnarray
            ((gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
              *)&sum,_gnarr);
  uVar4 = gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>::
          sum((gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
               *)&sum);
  auVar12._8_4_ = (int)(uVar4 >> 0x20);
  auVar12._0_8_ = uVar4;
  auVar12._12_4_ = 0x45300000;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->expf,(ulong)*i);
  dVar1 = *pvVar5;
  pvVar6 = std::vector<std::shared_ptr<Ensemble>,_std::allocator<std::shared_ptr<Ensemble>_>_>::
           operator[](this->V,(ulong)*i);
  std::shared_ptr<Ensemble>::shared_ptr((shared_ptr<Ensemble> *)&it,pvVar6);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>
  ::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>
              *)&eta);
  local_118 = 0.0;
  local_120 = (_Base_ptr)
              gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
              ::begin((gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
                       *)&sum);
  eta = (valtype)local_120;
  while( true ) {
    praw = (valtype)gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
                    ::end((gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
                           *)&sum);
    bVar3 = std::operator!=((_Self *)&eta,(_Self *)&praw);
    dVar9 = local_118;
    if (!bVar3) break;
    ppVar7 = std::
             _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>
                           *)&eta);
    uVar2 = ppVar7->second;
    auVar13._8_4_ = (int)(uVar2 >> 0x20);
    auVar13._0_8_ = uVar2;
    auVar13._12_4_ = 0x45300000;
    dVar9 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
            ((auVar12._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
    ppVar7 = std::
             _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>
                           *)&eta);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&ppVar7->first);
    gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>::
    coord2val((vector<double,_std::allocator<double>_> *)&pwham,
              (gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
               *)&sum,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    peVar8 = std::__shared_ptr_access<Ensemble,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Ensemble,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &it);
    (**peVar8->_vptr_Ensemble)(peVar8,&pwham);
    dVar10 = exp(-extraout_XMM0_Qa);
    dVar11 = gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>::
             operator[]((gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>
                         *)hist.nelms_tot,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    dVar10 = log(dVar9 / (dVar1 * dVar10 * dVar11));
    local_118 = dVar9 * dVar10 + local_118;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&pwham);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>
                  *)&eta);
  }
  std::shared_ptr<Ensemble>::~shared_ptr((shared_ptr<Ensemble> *)&it);
  gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>::~gnarray
            ((gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
              *)&sum);
  return dVar9;
}

Assistant:

valtype WHAM<PENSEMBLE,HISTOGRAM,NARRAY>::whamvsrawi(const uint& i, const NARRAY& rho) const {
  const HISTOGRAM hist = (*hists)[i];
  const valtype sum = hist.sum();
  const valtype Qinv = expf[i]; //this is the inverse of the partition function 
  const pEnsemble Vi = (*V)[i];
  typename HISTOGRAM::const_iterator it;
  valtype eta = 0; //eta in equation 41 from reference DOI: 10.1002/jcc.21989
  for(it = hist.begin(); it != hist.end(); ++it) {
    //this is the raw normalized HISTOGRAM from i'th simulation
    const valtype praw = it->second/sum;
    //next we calculate the consensus HISTOGRAM from the WHAM distribution
    const coordtype coord = it->first;
    const vector<valtype> vals = hist.coord2val(coord);
    const valtype pwham = Qinv * exp(-Vi->ener(vals)) * rho[coord];
    //then we calculate eta, the relative entropy between praw and pwham
    eta += praw * log(praw/pwham);
  }
  return eta;
}